

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O2

int32 stat_mtime(char *file)

{
  int iVar1;
  stat statbuf;
  stat sStack_98;
  
  iVar1 = stat(file,&sStack_98);
  return -(uint)(iVar1 != 0) | (uint)sStack_98.st_mtim.tv_sec;
}

Assistant:

int32
stat_mtime(const char *file)
{
    struct stat statbuf;

#ifdef HAVE_SYS_STAT_H
    if (stat(file, &statbuf) != 0)
        return -1;
#else /* HAVE_SYS_STAT_H */
    if (stat_retry(file, &statbuf) != 0)
        return -1;
#endif /* HAVE_SYS_STAT_H */

    return ((int32) statbuf.st_mtime);
}